

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O1

string * __thiscall
iDynTree::AccelerometerSensor::getName_abi_cxx11_
          (string *__return_storage_ptr__,AccelerometerSensor *this)

{
  AccelerometerPrivateAttributes *pAVar1;
  pointer pcVar2;
  
  pAVar1 = this->pimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pAVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar1->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string AccelerometerSensor::getName() const
{
    return this->pimpl->name;
}